

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setFixedHeight(QWidget *this,int h)

{
  QWidgetPrivate *this_00;
  pointer pQVar1;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int in_stack_0000000c;
  uint explMax;
  uint explMin;
  QWidgetPrivate *d;
  ushort uVar2;
  undefined4 in_stack_ffffffffffffffc0;
  ushort uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  QWidget *this_01;
  
  this_01 = *(QWidget **)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWidget *)0x36bd1d);
  QWidgetPrivate::createExtra
            ((QWidgetPrivate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pQVar1 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bd3a);
  uVar2 = *(ushort *)&pQVar1->field_0x7c & 1 | 2;
  pQVar1 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bd56);
  uVar3 = *(ushort *)&pQVar1->field_0x7c >> 2 & 1 | 2;
  minimumSize((QWidget *)this_00);
  QSize::width((QSize *)0x36bd7f);
  setMinimumSize(this_01,in_stack_0000000c,in_stack_00000008);
  maximumSize((QWidget *)this_00);
  QSize::width((QSize *)0x36bda6);
  setMaximumSize(this_01,in_stack_0000000c,in_stack_00000008);
  pQVar1 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bdcc);
  *(ushort *)&pQVar1->field_0x7c = (ushort)*(undefined4 *)&pQVar1->field_0x7c & 0xfffc | uVar2 & 3;
  pQVar1 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                     ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36bdf6);
  *(ushort *)&pQVar1->field_0x7c =
       ((ushort)*(undefined4 *)&pQVar1->field_0x7c & 0xfff3) + (uVar3 & 3) * 4;
  if (*(QWidget **)(in_FS_OFFSET + 0x28) == this_01) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setFixedHeight(int h)
{
    Q_D(QWidget);
    d->createExtra();
    uint explMin = d->extra->explicitMinSize | Qt::Vertical;
    uint explMax = d->extra->explicitMaxSize | Qt::Vertical;
    setMinimumSize(minimumSize().width(), h);
    setMaximumSize(maximumSize().width(), h);
    d->extra->explicitMinSize = explMin;
    d->extra->explicitMaxSize = explMax;
}